

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall
Alg::opimb_naive(Alg *this,Graph *graph,double budget,
                vector<double,_std::allocator<double>_> *budget_list,double epsilon,double delta,
                int mode)

{
  THyperGraph *this_00;
  uint uVar1;
  TResult *pTVar2;
  ResultInfo *this_01;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  ulong uVar11;
  byte bVar12;
  Graph *graph_00;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double local_180;
  double local_148;
  double timeb;
  double local_d8;
  double dStack_d0;
  double local_c0;
  double local_b8;
  THyperGraph *local_b0;
  double local_a8;
  HyperGraph *local_a0;
  long local_98;
  vector<double,_std::allocator<double>_> *local_90;
  double local_88;
  Timer local_80;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_80.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_80.__processName = "OPIM-B-NAIVE";
  local_80.__LastTime.__d.__r = local_80.__StartTime.__d.__r;
  local_80.__EndTime.__d.__r = local_80.__StartTime.__d.__r;
  poVar10 = std::operator<<((ostream *)&std::cout,"mode: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,mode);
  std::endl<char,std::char_traits<char>>(poVar10);
  dVar18 = 6.0 / delta;
  dVar3 = log(dVar18);
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,budget_list);
  iVar8 = cal_k_max((vector<double,_std::allocator<double>_> *)&local_48,budget);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,budget_list);
  iVar9 = cal_k_min((vector<double,_std::allocator<double>_> *)&local_60,budget);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  dVar17 = max_vector(budget_list);
  local_90 = budget_list;
  dVar16 = min_vector_nonzero(budget_list);
  poVar10 = std::operator<<((ostream *)&std::cout,"k_max: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar8);
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&std::cout,"k_min: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar9);
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&std::cout,"targetSize_max: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)(budget / dVar16));
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&std::cout,"targetSize_min: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)(budget / dVar17));
  std::endl<char,std::char_traits<char>>(poVar10);
  dVar17 = (double)this->__numV;
  dVar15 = (double)iVar8;
  dVar16 = log(dVar17);
  dVar4 = log(dVar18);
  dVar16 = (dVar16 * dVar15 + dVar4) * 0.31606027941427883;
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  dVar16 = dVar16 + dVar3 * 0.31606027941427883;
  dVar17 = ((dVar17 + dVar17) * dVar16 * dVar16) / (double)this->__numV;
  uVar11 = (ulong)dVar17;
  dVar3 = log((double)this->__numV);
  dVar18 = log(dVar18);
  dVar18 = (dVar3 * dVar15 + dVar18) * 0.31606027941427883;
  if (dVar18 < 0.0) {
    sqrt(dVar18);
  }
  dVar18 = log2(epsilon * epsilon * dVar15);
  local_98 = ((long)(dVar18 - 9.223372036854776e+18) & (long)dVar18 >> 0x3f | (long)dVar18) + 1;
  auVar20._8_4_ = (int)((ulong)local_98 >> 0x20);
  auVar20._0_8_ = local_98;
  auVar20._12_4_ = 0x45300000;
  dVar18 = (((auVar20._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_98) - 4503599627370496.0)) * 3.0) / delta;
  dVar3 = log(dVar18);
  dVar18 = log(dVar18);
  timeb = 0.0;
  local_a0 = &this->__hyperG;
  this_00 = &this->__hyperGVldt;
  local_a8 = (dVar3 + dVar3) / 9.0;
  dVar16 = dVar3 * 0.5;
  dVar18 = dVar18 * 0.5;
  local_b8 = SQRT(dVar16);
  local_c0 = SQRT(dVar18);
  bVar12 = 0;
  local_180 = 0.0;
  local_148 = 0.0;
  local_b0 = this_00;
  bVar6 = false;
  while( true ) {
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar10);
    graph_00 = (Graph *)(((long)(dVar17 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11) <<
                        (bVar12 & 0x3f));
    Timer::get_operation_time(&local_80);
    HyperGraph::build_n_RRsets(local_a0,(size_t)graph_00);
    HyperGraph::build_n_RRsets(this_00,(size_t)graph_00);
    poVar10 = std::operator<<((ostream *)&std::cout,"# RR sets: ");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::endl<char,std::char_traits<char>>(poVar10);
    this->__numRRsets = (this->__hyperG).__numRRsets;
    dVar4 = Timer::get_operation_time(&local_80);
    dVar15 = max_cover_lazy_budget(this,graph_00,budget,local_90,&timeb,mode);
    local_88 = Timer::get_operation_time(&local_80);
    dVar5 = HyperGraph::self_inf_cal(this_00,&this->__vecSeed);
    auVar21._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar21._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar21._12_4_ = 0x45300000;
    dStack_d0 = auVar21._8_8_ - 1.9342813113834067e+25;
    local_d8 = dStack_d0 + (auVar21._0_8_ - 4503599627370496.0);
    uVar1 = this->__numV;
    dVar19 = (dVar5 * local_d8) / (double)uVar1 + local_a8;
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    dVar23 = local_b8;
    if (dVar16 < 0.0) {
      dVar23 = sqrt(dVar16);
    }
    dVar22 = (local_d8 * (dVar15 / 0.31606027941427883)) / (double)uVar1 + dVar18;
    if (dVar22 < 0.0) {
      dVar22 = sqrt(dVar22);
    }
    else {
      dVar22 = SQRT(dVar22);
    }
    uVar13 = SUB84(local_c0,0);
    uVar14 = (undefined4)((ulong)local_c0 >> 0x20);
    if (dVar18 < 0.0) {
      local_d8 = dVar22;
      dVar22 = sqrt(dVar18);
      uVar13 = SUB84(dVar22,0);
      uVar14 = (undefined4)((ulong)dVar22 >> 0x20);
      dVar22 = local_d8;
    }
    dVar22 = dVar22 + (double)CONCAT44(uVar14,uVar13);
    local_148 = local_148 + dVar4;
    local_180 = local_180 + local_88;
    dVar19 = (dVar19 - dVar23) * (dVar19 - dVar23) - dVar3 / 18.0;
    dVar4 = 0.0;
    if (0.0 <= dVar19) {
      dVar4 = dVar19;
    }
    dVar4 = dVar4 / (dVar22 * dVar22);
    poVar10 = std::operator<<((ostream *)&std::cout," -->OPIM-B-NAIVE (");
    bVar12 = bVar12 + 1;
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10,"/");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::operator<<(poVar10,") approx. (max-cover): ");
    poVar10 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar10," (");
    poVar10 = std::ostream::_M_insert<double>(dVar15 / (dVar15 / 0.31606027941427883));
    poVar10 = std::operator<<(poVar10,"), #RR sets: ");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::operator<<(poVar10,'\n');
    if ((0.31606027941427883 - epsilon <= dVar4) && (bVar6)) break;
    bVar7 = bVar6;
    if (!bVar6) {
      bVar7 = true;
    }
    if (0.31606027941427883 - epsilon <= dVar4) {
      bVar6 = bVar7;
    }
  }
  pTVar2 = this->__tRes;
  pTVar2->__Approx = dVar4;
  dVar18 = Timer::get_total_time(&local_80);
  pTVar2->__RunningTime = dVar18;
  this_01 = this->__tRes;
  this_01->__Influence = dVar5;
  this_01->__InfluenceOriginal = dVar15;
  ResultInfo::set_seed_vec(this_01,&this->__vecSeed);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__tRes->__VecSeed_inf,&this->__vecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__tRes->__VecSeed_inf_cost,&this->__vecSeed_inf_cost);
  pTVar2 = this->__tRes;
  pTVar2->__BoundMin_inf = this->__boundMin_inf;
  pTVar2->__BoundMin_inf_cost = this->__boundMin_inf_cost;
  pTVar2->__RRsetsSize = this->__numRRsets * 2;
  std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
  poVar10 = std::ostream::_M_insert<double>(dVar5);
  std::operator<<(poVar10,", time: ");
  poVar10 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
  std::operator<<(poVar10,'\n');
  std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
  poVar10 = std::ostream::_M_insert<double>(local_148);
  std::operator<<(poVar10,", ");
  dVar18 = timeb;
  poVar10 = std::ostream::_M_insert<double>(local_180 - timeb);
  std::operator<<(poVar10,'\n');
  std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
  poVar10 = std::ostream::_M_insert<double>(dVar18);
  std::operator<<(poVar10,'\n');
  return 0.0;
}

Assistant:

double Alg::opimb_naive(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double delta, const int mode) {
    Timer timerOPIMC("OPIM-B-NAIVE");
    std::cout << "mode: " << mode << std::endl;
    const double e_alpha = exp(1);
    const double approx = 0.5 * (1 - 1.0 / e_alpha);
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    int targetSize_min = int(budget / max_vector(budget_list));
    int targetSize_max = int(budget / min_vector_nonzero(budget_list));
    std::cout << "k_max: " << k_max << std::endl;
    std::cout << "k_min: " << k_min << std::endl;
    std::cout << "targetSize_max: " << targetSize_max << std::endl;
    std::cout << "targetSize_min: " << targetSize_min << std::endl;
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2(0.5 * (1 - 1 / e_alpha) * alpha
            + sqrt(0.5 * (1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2(0.5 * (1 - 1 / e_alpha) * alpha
            + sqrt(0.5 * (1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    size_t idx = 0;
    int satisfy_count = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget(graph, budget, budget_list, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf / approx;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-NAIVE (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " << approxOPIMC <<
                  " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx - epsilon && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            return 0;
        }
        else if (approxOPIMC >= approx - epsilon && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}